

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O1

void __thiscall
pbrt::DigitPermutation::DigitPermutation
          (DigitPermutation *this,int base,uint32_t seed,Allocator alloc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint16_t *puVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t w;
  long lVar10;
  float fVar11;
  int vb;
  int va;
  undefined4 extraout_var;
  
  this->base = base;
  vb = 0x10000;
  va = base;
  if (base < 0x10000) {
    this->nDigits = 0;
    fVar11 = 1.0;
    iVar1 = 0;
    iVar7 = 0;
    do {
      fVar11 = (1.0 / (float)base) * fVar11;
      iVar7 = iVar7 + 1;
      iVar1 = iVar1 + base;
    } while (1.0 - fVar11 < 1.0);
    this->nDigits = iVar7;
    if (base == 0) {
      puVar4 = (uint16_t *)0x0;
    }
    else {
      iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                        (alloc.memoryResource,(long)iVar1 * 2,2);
      puVar4 = (uint16_t *)CONCAT44(extraout_var,iVar1);
    }
    this->permutations = puVar4;
    iVar1 = this->nDigits;
    if (0 < (long)iVar1) {
      uVar8 = base - 1U >> 1 | base - 1U;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      uVar8 = uVar8 >> 0x10 | uVar8;
      lVar10 = 0;
      do {
        if (0 < base) {
          uVar2 = base * 0x100 + (int)lVar10 ^ seed;
          uVar9 = (ulong)(uVar2 >> 0x1f ^ uVar2) * 0x7fb5d329728ea185;
          lVar5 = (uVar9 >> 0x1b ^ uVar9) * -0x7e25210b43d22bb3;
          uVar2 = (uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5;
          uVar9 = 0;
          do {
            uVar6 = uVar9 & 0xffffffff;
            do {
              uVar3 = ((uint)uVar6 ^ uVar2) * -0x1e8f76c3 ^ uVar2 >> 0x10;
              uVar3 = ((uVar3 & uVar8) >> 4 ^ uVar2 >> 8 ^ uVar3) * 0x929eb3f ^ uVar2 >> 0x17;
              uVar3 = ((uVar3 & uVar8) >> 1 ^ uVar3) * (uVar2 >> 0x1b | 1) * 0x6935fa69;
              uVar3 = ((uVar3 & uVar8) >> 0xb ^ uVar3) * 0x74dcb303;
              uVar3 = ((uVar3 & uVar8) >> 2 ^ uVar3) * -0x61afe33d;
              uVar3 = ((uVar3 & uVar8) >> 2 ^ uVar3) * -0x379f5c21 & uVar8;
              uVar3 = uVar3 >> 5 ^ uVar3;
              uVar6 = (ulong)uVar3;
            } while ((uint)base <= uVar3);
            puVar4[uVar9 + lVar10 * (ulong)(uint)base] = (uint16_t)((uVar3 + uVar2) % (uint)base);
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uint)base);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != iVar1);
    }
    return;
  }
  LogFatal<char_const(&)[5],char_const(&)[6],char_const(&)[5],int&,char_const(&)[6],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/lowdiscrepancy.h"
             ,0x1e,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [5])0x3cf247,
             (char (*) [6])"65536",(char (*) [5])0x3cf247,&va,(char (*) [6])"65536",&vb);
}

Assistant:

DigitPermutation(int base, uint32_t seed, Allocator alloc) : base(base) {
        CHECK_LT(base, 65536);  // uint16_t
        // Compute number of digits needed for _base_
        nDigits = 0;
        Float invBase = (Float)1 / (Float)base, invBaseN = 1;
        while (1 - invBaseN < 1) {
            ++nDigits;
            invBaseN *= invBase;
        }

        permutations = alloc.allocate_object<uint16_t>(nDigits * base);
        for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
            // Compute random permutation for _digitIndex_
            uint32_t digitSeed = MixBits(((base << 8) + digitIndex) ^ seed);
            for (int digitValue = 0; digitValue < base; ++digitValue) {
                int index = digitIndex * base + digitValue;
                permutations[index] = PermutationElement(digitValue, base, digitSeed);
            }
        }
    }